

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBox::keyPressEvent(QAbstractSpinBox *this,QKeyEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  QArrayData *pQVar1;
  long lVar2;
  bool bVar3;
  qsizetype qVar4;
  int iVar5;
  char cVar6;
  byte bVar7;
  Int IVar8;
  int iVar9;
  uint uVar10;
  KeyboardModifier KVar11;
  ulong uVar12;
  QStyle *pQVar13;
  QLineEdit *this_01;
  int iVar14;
  bool bVar15;
  long in_FS_OFFSET;
  QStringView QVar16;
  QLatin1String QVar17;
  QString local_78;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data aStack_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  IVar8 = QKeyEvent::modifiers();
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = IVar8;
  pQVar1 = *(QArrayData **)(event + 0x28);
  lVar2 = *(long *)(event + 0x38);
  if (pQVar1 == (QArrayData *)0x0) {
    if (lVar2 != 0) goto LAB_0047994f;
  }
  else {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (lVar2 == 0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    else {
LAB_0047994f:
      iVar9 = QLineEdit::cursorPosition(this_00->edit);
      lVar2 = (this_00->prefix).d.size;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (iVar9 < lVar2) {
        QLineEdit::setCursorPosition(this_00->edit,(int)(this_00->prefix).d.size);
      }
    }
  }
  iVar9 = *(int *)(event + 0x40);
  switch(iVar9) {
  case 0x1000004:
  case 0x1000005:
    lVar2 = *(long *)(*(long *)&(this_00->edit->super_QWidget).field_0x8 + 600);
    if (*(long *)(lVar2 + 0x100) != *(long *)(lVar2 + 0xf8)) {
      *(long *)(lVar2 + 0x100) = *(long *)(lVar2 + 0xf8);
    }
    *(undefined8 *)(lVar2 + 0xf0) = 0;
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd0))
              (this_00,*(uint *)&this_00->field_0x3d0 >> 6 & 1);
    selectAll(this);
    event[0xc] = (QKeyEvent)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QLineEdit::returnPressed(this_00->edit);
      return;
    }
    goto LAB_00479e9e;
  case 0x1000006:
  case 0x1000007:
  case 0x1000008:
  case 0x1000009:
  case 0x100000a:
  case 0x100000b:
  case 0x100000c:
  case 0x100000d:
  case 0x100000e:
  case 0x100000f:
  case 0x1000012:
  case 0x1000014:
switchD_004799bc_caseD_1000006:
    cVar6 = QKeyEvent::matches((StandardKey)event);
    if (cVar6 == '\0') goto LAB_00479e1c;
    selectAll(this);
    event[0xc] = (QKeyEvent)0x1;
    break;
  case 0x1000010:
  case 0x1000011:
    uVar10 = QKeyEvent::modifiers();
    if ((uVar10 >> 0x19 & 1) != 0) {
      iVar9 = QLineEdit::cursorPosition(this_00->edit);
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QLineEdit::displayText(&local_78,this_00->edit);
      if (*(int *)(event + 0x40) == 0x1000011) {
        if (((iVar9 != 0) || ((this_00->prefix).d.size == 0)) &&
           (lVar2 = (this_00->suffix).d.size, (long)iVar9 < local_78.d.size - lVar2)) {
          this_01 = this_00->edit;
          iVar14 = (int)local_78.d.size - ((int)lVar2 + iVar9);
LAB_00479c56:
          QLineEdit::setSelection(this_01,iVar9,iVar14);
          event[0xc] = (QKeyEvent)0x1;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          break;
        }
      }
      else if ((((QAbstractSpinBox *)local_78.d.size != (QAbstractSpinBox *)(long)iVar9) ||
               ((this_00->suffix).d.size == 0)) && (lVar2 = (this_00->prefix).d.size, lVar2 < iVar9)
              ) {
        this_01 = this_00->edit;
        iVar14 = (int)lVar2 - iVar9;
        goto LAB_00479c56;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    goto LAB_00479e1c;
  case 0x1000013:
  case 0x1000015:
    event[0xc] = (QKeyEvent)0x1;
    iVar14 = 1;
    bVar15 = false;
LAB_00479bbf:
    bVar7 = (**(code **)(*(long *)this + 0x1c8))(this);
    if ((bVar7 & (iVar9 != 0x1000013) + 1U) != 0) {
      if (bVar15) {
        if (iVar9 == 0x1000013) {
          bVar15 = true;
LAB_00479c20:
          bVar3 = bVar15;
          bVar15 = true;
        }
        else {
          iVar14 = -iVar14;
          bVar15 = false;
          bVar3 = true;
        }
      }
      else {
        KVar11 = QKeyEvent::modifiers();
        iVar5 = iVar14 * 10;
        if ((this_00->stepModifier & KVar11) == NoModifier) {
          iVar5 = iVar14;
        }
        iVar14 = iVar5;
        bVar3 = false;
        bVar15 = false;
        if (iVar9 == 0x1000013) goto LAB_00479c20;
        iVar14 = -iVar14;
        bVar15 = false;
      }
      pQVar13 = QWidget::style((QWidget *)this);
      iVar9 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x2a,0,this,0);
      if (iVar9 != 0) {
        this_00->buttonState = (uint)(bVar15 ^ 1) * 0x10 + 0x11;
      }
      if ((this_00->spinClickTimer).m_id == Invalid) {
        (**(code **)(*(long *)this + 0x1b0))(this,iVar14);
      }
      if (((!bVar3 && *(short *)(event + 0x50) < 0) &&
          ((this_00->spinClickThresholdTimer).m_id == Invalid)) &&
         ((this_00->spinClickTimer).m_id == Invalid)) {
        QAbstractSpinBoxPrivate::updateState(this_00,bVar15,true);
      }
      aStack_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      aStack_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      aStack_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr._0_4_ = 0x80c1;
      local_78.d.ptr._4_4_ = 0xaaaaaaaa;
      local_60 = 0xaaaaaaaaffffffff;
      local_78.d.d = (Data *)QTextDocument::setMarkdown;
      local_78.d.size = (qsizetype)this;
      ::QVariant::QVariant((QVariant *)&aStack_58,&this_00->value);
      local_78.d.ptr = (char16_t *)CONCAT44(local_78.d.ptr._4_4_,0x800e);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_78);
    }
    break;
  case 0x1000016:
  case 0x1000017:
    event[0xc] = (QKeyEvent)0x1;
    if (iVar9 != 0x1000016) {
      bVar15 = true;
      iVar14 = 10;
      goto LAB_00479bbf;
    }
    uVar12 = (**(code **)(*(long *)this + 0x1c8))(this);
    if ((uVar12 & 1) != 0) {
      iVar14 = 10;
      bVar15 = true;
      goto LAB_00479c20;
    }
    break;
  default:
    if (iVar9 != 0x55) goto switchD_004799bc_caseD_1000006;
    uVar10 = QKeyEvent::modifiers();
    if ((uVar10 >> 0x1a & 1) != 0) {
      QGuiApplication::platformName();
      if ((QAbstractSpinBox *)local_78.d.size == (QAbstractSpinBox *)0x3) {
        QVar16.m_data = local_78.d.ptr;
        QVar16.m_size = 3;
        QVar17.m_data = "xcb";
        QVar17.m_size = 3;
        cVar6 = QtPrivate::equalStrings(QVar16,QVar17);
      }
      else {
        cVar6 = '\0';
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar6 != '\0') {
        event[0xc] = (QKeyEvent)0x1;
        if ((*(byte *)(*(long *)(this + 8) + 0x3d0) & 2) == 0) {
          (**(code **)(*(long *)this + 0x1b8))(this);
        }
        break;
      }
    }
LAB_00479e1c:
    (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
    QLineEdit::text(&local_78,this_00->edit);
    qVar4 = local_78.d.size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QAbstractSpinBox *)qVar4 != (QAbstractSpinBox *)0x0) {
      this_00->field_0x3d0 = this_00->field_0x3d0 & 0x7f;
    }
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) {
      this_00->field_0x3d1 = this_00->field_0x3d1 | 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00479e9e:
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::keyPressEvent(QKeyEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();

    if (!event->text().isEmpty() && d->edit->cursorPosition() < d->prefix.size())
        d->edit->setCursorPosition(d->prefix.size());

    int steps = 1;
    bool isPgUpOrDown = false;
    switch (event->key()) {
    case Qt::Key_PageUp:
    case Qt::Key_PageDown:
        steps *= 10;
        isPgUpOrDown = true;
        Q_FALLTHROUGH();
    case Qt::Key_Up:
    case Qt::Key_Down: {
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Reserve up/down for nav - use left/right for edit.
            if (!hasEditFocus() && (event->key() == Qt::Key_Up
                                    || event->key() == Qt::Key_Down)) {
                event->ignore();
                return;
            }
        }
#endif
        event->accept();
        const bool up = (event->key() == Qt::Key_PageUp || event->key() == Qt::Key_Up);
        if (!(stepEnabled() & (up ? StepUpEnabled : StepDownEnabled)))
            return;
        if (!isPgUpOrDown && (event->modifiers() & d->stepModifier))
            steps *= 10;
        if (!up)
            steps *= -1;
        if (style()->styleHint(QStyle::SH_SpinBox_AnimateButton, nullptr, this)) {
            d->buttonState = (Keyboard | (up ? Up : Down));
        }
        if (!d->spinClickTimer.isActive())
            stepBy(steps);
        if (event->isAutoRepeat() && !isPgUpOrDown) {
            if (!d->spinClickThresholdTimer.isActive() && !d->spinClickTimer.isActive()) {
                d->updateState(up, true);
            }
        }
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(this, d->value);
        QAccessible::updateAccessibility(&event);
#endif
        return;
    }
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Left:
    case Qt::Key_Right:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
    case Qt::Key_Back:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
#endif
    case Qt::Key_Enter:
    case Qt::Key_Return:
        d->edit->d_func()->control->clearUndo();
        d->interpret(d->keyboardTracking ? AlwaysEmit : EmitIfChanged);
        selectAll();
        event->ignore();
        emit editingFinished();
        emit returnPressed();
        emit d->edit->returnPressed();
        return;

#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Toggles between left/right moving cursor and inc/dec.
            setEditFocus(!hasEditFocus());
        }
        return;
#endif

    case Qt::Key_U:
        if (event->modifiers() & Qt::ControlModifier
            && QGuiApplication::platformName() == "xcb"_L1) { // only X11
            event->accept();
            if (!isReadOnly())
                clear();
            return;
        }
        break;

    case Qt::Key_End:
    case Qt::Key_Home:
        if (event->modifiers() & Qt::ShiftModifier) {
            int currentPos = d->edit->cursorPosition();
            const QString text = d->edit->displayText();
            if (event->key() == Qt::Key_End) {
                if ((currentPos == 0 && !d->prefix.isEmpty()) || text.size() - d->suffix.size() <= currentPos) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, text.size() - d->suffix.size() - currentPos);
                }
            } else {
                if ((currentPos == text.size() && !d->suffix.isEmpty()) || currentPos <= d->prefix.size()) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, d->prefix.size() - currentPos);
                }
            }
            event->accept();
            return;
        }
        break;

    default:
#ifndef QT_NO_SHORTCUT
        if (event == QKeySequence::SelectAll) {
            selectAll();
            event->accept();
            return;
        }
#endif
        break;
    }

    d->edit->event(event);
    if (!d->edit->text().isEmpty())
        d->cleared = false;
    if (!isVisible())
        d->ignoreUpdateEdit = true;
}